

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baillie_bench.cpp
# Opt level: O2

void BM_rabinMiller(State *state)

{
  mapped_type *pmVar1;
  long lVar2;
  bool bVar3;
  allocator<char> local_51;
  key_type local_50;
  
  if (state[0x1a] == (State)0x0) {
    lVar2 = *(long *)(state + 0x10);
  }
  else {
    lVar2 = 0;
  }
  benchmark::State::StartKeepRunning(state);
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    if (*(unsigned_long **)(state + 0x28) == *(unsigned_long **)(state + 0x20)) goto LAB_00109ae0;
    bVar3 = baillieTest(**(unsigned_long **)(state + 0x20));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"IS PRIME",&local_51);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
                           *)(state + 0x40),&local_50);
    pmVar1->value = (double)bVar3;
    pmVar1->flags = kDefaults;
    pmVar1->oneK = kIs1000;
    std::__cxx11::string::~string((string *)&local_50);
  }
  benchmark::State::FinishKeepRunning(state);
  if (*(undefined8 **)(state + 0x28) != *(undefined8 **)(state + 0x20)) {
    *(undefined8 *)(state + 0x38) = **(undefined8 **)(state + 0x20);
    return;
  }
LAB_00109ae0:
  __assert_fail("range_.size() > pos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bitwyre[P]baillie_psw/benchmark.h"
                ,0x272,"int64_t benchmark::State::range(std::size_t) const");
}

Assistant:

static void BM_rabinMiller(benchmark::State& state) {

  for (auto _ : state) {
      int k = 4;
      auto res = baillieTest(state.range(0));
      state.counters["IS PRIME"] = res; 
  }
  state.SetComplexityN(state.range(0));
}